

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_scalar_matrix_division_Test::~test_matrix_sparse_scalar_matrix_division_Test
          (test_matrix_sparse_scalar_matrix_division_Test *this)

{
  test_matrix_sparse_scalar_matrix_division_Test *this_local;
  
  ~test_matrix_sparse_scalar_matrix_division_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, scalar_matrix_division) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, -4.0, 5.0}, 3);
  Matrix_Sparse matrix_result = matrix / 10.0;

  EXPECT_EQ(matrix_result.size_row(), 3);
  EXPECT_EQ(matrix_result.size_column(), 3);
  EXPECT_EQ(matrix_result.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix_result[0][1], 0.30);
  EXPECT_DOUBLE_EQ(matrix_result[1][0], -0.4);
  EXPECT_DOUBLE_EQ(matrix_result[1][2], 0.5);
}